

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::node::put_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_int)> *f,
          function<void_(libtorrent::dht::item_&)> *data_cb)

{
  _Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
  *this_00;
  dht_observer *pdVar1;
  int iVar2;
  function<void_(const_libtorrent::dht::item_&,_int)> *out;
  span<const_char> in;
  undefined1 local_b9;
  shared_ptr<libtorrent::dht::get_item> ta;
  shared_ptr<libtorrent::dht::put_data> put_ta;
  _Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::shared_ptr<libtorrent::dht::put_data>_&)>
  local_90;
  char hex_key [65];
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    out = f;
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      in.m_len = (difference_type)hex_key;
      in.m_ptr = &DAT_00000020;
      aux::to_hex((aux *)pk,in,(char *)out);
      (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                (this->m_observer,1,"starting put for [ key: %s ]",hex_key);
    }
  }
  put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::dht::put_data,std::allocator<libtorrent::dht::put_data>,libtorrent::dht::node&,std::function<void(libtorrent::dht::item_const&,int)>&>
            (&put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(put_data **)&put_ta,(allocator<libtorrent::dht::put_data> *)hex_key,this,
             f);
  ::std::__shared_ptr<libtorrent::dht::put_data,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<libtorrent::dht::put_data,libtorrent::dht::put_data>
            ((__shared_ptr<libtorrent::dht::put_data,(__gnu_cxx::_Lock_policy)2> *)&put_ta,
             put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  hex_key._0_8_ = anon_unknown_0::put_data_cb;
  this_00 = (_Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
             *)(hex_key + 8);
  ::std::
  _Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
  ::
  _Tuple_impl<std::shared_ptr<libtorrent::dht::put_data>&,std::function<void(libtorrent::dht::item&)>&,void>
            (this_00,&put_ta,data_cb);
  local_90._M_f = anon_unknown_0::put;
  local_90._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
  super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::dht::get_item,std::allocator<libtorrent::dht::get_item>,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>))(libtorrent::dht::item_const&,bool,std::shared_ptr<libtorrent::dht::put_data>const&,std::function<void(libtorrent::dht::item&)>const&)>,std::_Bind<void(*(std::_Placeholder<1>,std::shared_ptr<libtorrent::dht::put_data>))(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,std::shared_ptr<libtorrent::dht::put_data>const&)>>
            (&ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(get_item **)&ta,(allocator<libtorrent::dht::get_item> *)&local_b9,this,pk
             ,salt,(_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>))(const_libtorrent::dht::item_&,_bool,_const_std::shared_ptr<libtorrent::dht::put_data>_&,_const_std::function<void_(libtorrent::dht::item_&)>_&)>
                    *)hex_key,&local_90);
  ::std::__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<libtorrent::dht::get_item,libtorrent::dht::get_item>
            ((__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2> *)&ta,
             ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_90._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>.
      super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
      super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90._M_bound_args.
               super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>_>
               .super__Tuple_impl<1UL,_std::shared_ptr<libtorrent::dht::put_data>_>.
               super__Head_base<1UL,_std::shared_ptr<libtorrent::dht::put_data>,_false>._M_head_impl
               .super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (hex_key._48_8_ != 0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hex_key._48_8_);
  }
  if (hex_key._24_8_ != 0) {
    (*(code *)hex_key._24_8_)(this_00,this_00,3);
  }
  (*((ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  if (ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void node::put_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, int)> f
	, std::function<void(item&)> data_cb)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting put for [ key: %s ]", hex_key);
	}
#endif

	auto put_ta = std::make_shared<dht::put_data>(*this, f);

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt
		, std::bind(&put_data_cb, _1, _2, put_ta, data_cb)
		, std::bind(&put, _1, put_ta));
	ta->start();
}